

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack6_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  uVar1 = *(ulong *)in;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar5,0x54);
  auVar5 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar5,_DAT_0019fe00);
  auVar5 = vpinsrd_avx(auVar2,(uint)(uVar1 >> 6) & 0x3ffffff,1);
  auVar5 = vpunpcklqdq_avx(auVar5,auVar3);
  auVar7._8_4_ = 0x3f;
  auVar7._0_8_ = 0x3f0000003f;
  auVar7._12_4_ = 0x3f;
  auVar10._16_4_ = 0x3f;
  auVar10._0_16_ = auVar7;
  auVar10._20_4_ = 0x3f;
  auVar10._24_4_ = 0x3f;
  auVar10._28_4_ = 0x3f;
  auVar5 = vpand_avx(auVar5,auVar7);
  *(undefined1 (*) [16])out = auVar5;
  out[4] = (uint)uVar1 >> 0x18 & 0x3f;
  auVar3 = vpmovsxbd_avx(ZEXT416(0x100a041e));
  auVar6 = vpsrlvd_avx2(auVar2,auVar3);
  uVar4 = (uint)(uVar1 >> 0x20);
  auVar5 = vpinsrd_avx(auVar7,uVar4 * 4 & 0x3c,0);
  auVar2 = vpor_avx(auVar6,auVar5);
  auVar5 = vpand_avx(auVar6,auVar7);
  auVar5 = vpblendd_avx2(auVar5,auVar2,1);
  *(undefined1 (*) [16])(out + 5) = auVar5;
  out[9] = uVar4 >> 0x16 & 0x3f;
  out[10] = uVar4 >> 0x1c;
  uVar1 = *(ulong *)(in + 2);
  out[10] = uVar4 >> 0x1c | ((uint)uVar1 & 3) << 4;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_0019fe20);
  auVar6 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar6,_DAT_0019fe30);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar9._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar5;
  auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  auVar11._0_8_ = auVar2._0_8_;
  auVar11._8_8_ = auVar11._0_8_;
  auVar11._16_8_ = auVar11._0_8_;
  auVar11._24_8_ = auVar11._0_8_;
  auVar11 = vpblendd_avx2(auVar9,auVar11,0xc0);
  auVar11 = vpand_avx2(auVar11,auVar10);
  auVar10 = vpsrld_avx2(auVar9,0x1a);
  auVar11 = vpblendd_avx2(auVar11,auVar10,0x10);
  *(undefined1 (*) [32])(out + 0xb) = auVar11;
  auVar5 = vpsrlvd_avx2(auVar6,_DAT_0019fe40);
  auVar5 = vpand_avx(auVar5,auVar7);
  *(long *)(out + 0x13) = auVar5._0_8_;
  uVar1 = *(ulong *)(in + 4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar6,0x54);
  auVar5 = vpmovsxbq_avx(ZEXT216(5));
  auVar5 = vpermi2d_avx512vl(auVar5,auVar6,auVar8);
  auVar6 = vpsrlvd_avx2(auVar5,auVar3);
  auVar5 = vpinsrd_avx(auVar7,(uint)uVar1 * 4 & 0x3c,0);
  auVar3 = vpor_avx(auVar6,auVar5);
  auVar5 = vpand_avx(auVar6,auVar7);
  auVar5 = vpblendd_avx2(auVar5,auVar3,1);
  *(undefined1 (*) [16])(out + 0x15) = auVar5;
  out[0x19] = (uint)uVar1 >> 0x16 & 0x3f;
  auVar2 = vpsrlvd_avx2(auVar2,_DAT_0019fe60);
  uVar4 = (uint)(uVar1 >> 0x20);
  auVar5 = vpinsrd_avx(auVar7,(uVar4 & 3) << 4,0);
  auVar3 = vpor_avx(auVar2,auVar5);
  auVar5 = vpand_avx(auVar2,auVar7);
  auVar5 = vpblendd_avx2(auVar5,auVar3,1);
  *(undefined1 (*) [16])(out + 0x1a) = auVar5;
  out[0x1e] = uVar4 >> 0x14 & 0x3f;
  out[0x1f] = uVar4 >> 0x1a;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack6_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;

  return in;
}